

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_storage.cpp
# Opt level: O1

void __thiscall
duckdb::LocalTableStorage::LocalTableStorage
          (LocalTableStorage *this,ClientContext *context,DataTable *table)

{
  TableIndexList *__mutex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  int iVar3;
  Allocator *pAVar4;
  DataTableInfo *pDVar5;
  type __args_1;
  RowGroupCollection *pRVar6;
  type table_info;
  pointer pIVar7;
  undefined4 extraout_var;
  pointer pEVar8;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *expr;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  pointer puVar9;
  RowGroupCollection *__tmp;
  pointer this_02;
  IndexConstraintType constraint_type;
  templated_unique_single_t delete_index;
  templated_unique_single_t index;
  shared_ptr<duckdb::DataTableInfo,_true> data_table_info;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  expressions;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  delete_expressions;
  vector<duckdb::LogicalType,_true> types;
  IndexConstraintType local_d9;
  Index *local_d8;
  OptimisticDataWriter *local_d0;
  LocalTableStorage *local_c8;
  _Head_base<0UL,_duckdb::Index_*,_false> local_c0;
  _Head_base<0UL,_duckdb::Index_*,_false> local_b8;
  Index *local_b0;
  shared_ptr<duckdb::DataTableInfo,_true> local_a8;
  RowGroupCollection *local_98;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_90;
  undefined8 local_88;
  pthread_mutex_t *local_80;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  local_78;
  pointer local_60;
  TableIndexList *local_58;
  TableIndexList *local_50;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_48;
  
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_enable_shared_from_this<duckdb::LocalTableStorage>).__weak_this_.internal.
  super___weak_ptr<duckdb::LocalTableStorage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->table_ref)._M_data = table;
  pAVar4 = Allocator::Get(table->db);
  this->allocator = pAVar4;
  switchD_01306cb1::default(&this->row_groups,0,0x91);
  this->deleted_rows = 0;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optimistic_collections).
  super_vector<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowGroupCollection,_std::default_delete<duckdb::RowGroupCollection>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0 = &this->optimistic_writer;
  OptimisticDataWriter::OptimisticDataWriter(&this->optimistic_writer,table);
  this->merged_storage = false;
  this->is_dropped = false;
  (this->collections_lock).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->collections_lock).super___mutex_base._M_mutex + 0x10) = 0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->collections_lock).super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  DataTable::GetTypes((vector<duckdb::LogicalType,_true> *)&local_48,table);
  local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (table->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (table->info).internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&table->info);
  __args_1 = shared_ptr<duckdb::TableIOManager,_true>::operator*(&pDVar5->table_io_manager);
  local_78.
  super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_78.
                        super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  local_98 = (element_type *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::RowGroupCollection,std::allocator<duckdb::RowGroupCollection>,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::TableIOManager&,duckdb::vector<duckdb::LogicalType,true>&,long_const&,int>
            (&_Stack_90,&local_98,(allocator<duckdb::RowGroupCollection> *)&local_d8,&local_a8,
             __args_1,(vector<duckdb::LogicalType,_true> *)&local_48,&MAX_ROW_ID,(int *)&local_78);
  _Var2._M_pi = _Stack_90._M_pi;
  pRVar6 = local_98;
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_90._M_pi)->_M_use_count = (_Stack_90._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_90._M_pi)->_M_use_count = (_Stack_90._M_pi)->_M_use_count + 1;
    }
  }
  if (_Stack_90._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_90._M_pi);
  }
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pRVar6;
  this_00 = (this->row_groups).internal.
            super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi;
  (this->row_groups).internal.
  super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pRVar6 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  RowGroupCollection::InitializeEmpty(pRVar6);
  pDVar5 = shared_ptr<duckdb::DataTableInfo,_true>::operator->(&local_a8);
  table_info = shared_ptr<duckdb::DataTableInfo,_true>::operator*(&local_a8);
  __mutex = &pDVar5->indexes;
  TableIndexList::InitializeIndexes(__mutex,context,table_info,"ART");
  local_c8 = this;
  local_80 = (pthread_mutex_t *)__mutex;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 == 0) {
    this_02 = (pDVar5->indexes).indexes.
              super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              .
              super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar9 = (pDVar5->indexes).indexes.
             super_vector<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             .
             super__Vector_base<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (this_02 != puVar9) {
      local_58 = &local_c8->append_indexes;
      local_50 = &local_c8->delete_indexes;
      local_60 = puVar9;
      do {
        pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                           (this_02);
        iVar3 = (*pIVar7->_vptr_Index[2])(pIVar7);
        if ((char)iVar3 != '\0') {
          pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                             (this_02);
          iVar3 = (*pIVar7->_vptr_Index[3])(pIVar7);
          iVar3 = ::std::__cxx11::string::compare((char *)CONCAT44(extraout_var,iVar3));
          if (iVar3 == 0) {
            pIVar7 = unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>::operator->
                               (this_02);
            iVar3 = (*pIVar7->_vptr_Index[5])(pIVar7);
            local_d9 = (IndexConstraintType)iVar3;
            if (local_d9 != NONE) {
              local_98 = (element_type *)0x0;
              _Stack_90._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_88 = 0;
              local_78.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              local_78.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_78.
              super__Vector_base<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              puVar1 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                        *)pIVar7[2].column_ids.
                          super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage;
              for (this_01 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                              *)pIVar7[2].column_ids.
                                super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish; this_01 != puVar1;
                  this_01 = this_01 + 1) {
                pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_01);
                (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])
                          ((duckdb *)&local_d8,pEVar8);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&local_98,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_d8);
                if (local_d8 != (Index *)0x0) {
                  (*local_d8->_vptr_Index[1])();
                }
                pEVar8 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         ::operator->(this_01);
                (*(pEVar8->super_BaseExpression)._vptr_BaseExpression[0x11])
                          ((duckdb *)&local_d8,pEVar8);
                ::std::
                vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                ::
                emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                          ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                            *)&local_78,
                           (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                            *)&local_d8);
                if (local_d8 != (Index *)0x0) {
                  (*local_d8->_vptr_Index[1])();
                }
              }
              iVar3 = (*pIVar7->_vptr_Index[4])(pIVar7);
              make_uniq<duckdb::ART,std::__cxx11::string_const&,duckdb::IndexConstraintType&,duckdb::vector<unsigned_long,true>const&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::AttachedDatabase&>
                        ((duckdb *)&local_d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_00,iVar3),&local_d9,&pIVar7->column_ids,
                         pIVar7->table_io_manager,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&local_78,pIVar7->db);
              local_b8._M_head_impl = local_d8;
              local_d8 = (Index *)0x0;
              TableIndexList::AddIndex
                        (local_50,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                   *)&local_b8);
              if (local_b8._M_head_impl != (Index *)0x0) {
                (*(local_b8._M_head_impl)->_vptr_Index[1])();
              }
              local_b8._M_head_impl = (Index *)0x0;
              iVar3 = (*pIVar7->_vptr_Index[4])(pIVar7);
              make_uniq<duckdb::ART,std::__cxx11::string_const&,duckdb::IndexConstraintType&,duckdb::vector<unsigned_long,true>const&,duckdb::TableIOManager&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,duckdb::AttachedDatabase&>
                        ((duckdb *)&local_b0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(extraout_var_01,iVar3),&local_d9,&pIVar7->column_ids,
                         pIVar7->table_io_manager,
                         (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                          *)&local_98,pIVar7->db);
              local_c0._M_head_impl = local_b0;
              local_b0 = (Index *)0x0;
              TableIndexList::AddIndex
                        (local_58,(unique_ptr<duckdb::Index,_std::default_delete<duckdb::Index>,_true>
                                   *)&local_c0);
              puVar9 = local_60;
              if (local_c0._M_head_impl != (Index *)0x0) {
                (*(local_c0._M_head_impl)->_vptr_Index[1])();
              }
              local_c0._M_head_impl = (Index *)0x0;
              if (local_b0 != (Index *)0x0) {
                (*local_b0->_vptr_Index[1])();
              }
              if (local_d8 != (Index *)0x0) {
                (*local_d8->_vptr_Index[1])();
              }
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::~vector(&local_78);
              ::std::
              vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
              ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                         *)&local_98);
            }
          }
        }
        this_02 = this_02 + 1;
      } while (this_02 != puVar9);
    }
    pthread_mutex_unlock(local_80);
    if (local_a8.internal.super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_a8.internal.
                 super___shared_ptr<duckdb::DataTableInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_48);
    return;
  }
  ::std::__throw_system_error(iVar3);
}

Assistant:

LocalTableStorage::LocalTableStorage(ClientContext &context, DataTable &table)
    : table_ref(table), allocator(Allocator::Get(table.db)), deleted_rows(0), optimistic_writer(table),
      merged_storage(false) {

	auto types = table.GetTypes();
	auto data_table_info = table.GetDataTableInfo();
	auto &io_manager = TableIOManager::Get(table);
	row_groups = make_shared_ptr<RowGroupCollection>(data_table_info, io_manager, types, MAX_ROW_ID, 0);
	row_groups->InitializeEmpty();

	data_table_info->GetIndexes().BindAndScan<ART>(context, *data_table_info, [&](ART &art) {
		auto constraint_type = art.GetConstraintType();
		if (constraint_type == IndexConstraintType::NONE) {
			return false;
		}

		// UNIQUE constraint.
		vector<unique_ptr<Expression>> expressions;
		vector<unique_ptr<Expression>> delete_expressions;
		for (auto &expr : art.unbound_expressions) {
			expressions.push_back(expr->Copy());
			delete_expressions.push_back(expr->Copy());
		}

		// Create a delete index and a local index.
		auto delete_index = make_uniq<ART>(art.GetIndexName(), constraint_type, art.GetColumnIds(),
		                                   art.table_io_manager, std::move(delete_expressions), art.db);
		delete_indexes.AddIndex(std::move(delete_index));

		auto index = make_uniq<ART>(art.GetIndexName(), constraint_type, art.GetColumnIds(), art.table_io_manager,
		                            std::move(expressions), art.db);
		append_indexes.AddIndex(std::move(index));
		return false;
	});
}